

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O2

int mbedtls_aes_setkey_enc(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  uint3 uVar1;
  byte bVar2;
  uint i;
  int iVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  uint8_t pow [256];
  byte abStack_238 [520];
  
  if (keybits == 0x80) {
    iVar4 = 10;
  }
  else if (keybits == 0x100) {
    iVar4 = 0xe;
  }
  else {
    if (keybits != 0xc0) {
      return -0x20;
    }
    iVar4 = 0xc;
  }
  ctx->nr = iVar4;
  if (aes_init_done == '\0') {
    bVar2 = 1;
    for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
      abStack_238[lVar6 + 0x100] = bVar2;
      abStack_238[bVar2] = (byte)lVar6;
      bVar2 = (char)bVar2 >> 7 & 0x1bU ^ bVar2 * '\x02' ^ bVar2;
    }
    uVar9 = 1;
    for (lVar6 = 0; lVar6 != 0x28; lVar6 = lVar6 + 4) {
      *(uint *)((long)round_constants + lVar6) = uVar9 & 0xff;
      uVar9 = (uint)(int)(char)uVar9 >> 7 & 0x1b ^ (uVar9 & 0xff) * 2;
    }
    FSb[0] = 'c';
    RSb[99] = '\0';
    for (lVar6 = 1; lVar6 != 0x100; lVar6 = lVar6 + 1) {
      bVar2 = abStack_238[((ulong)abStack_238[lVar6] ^ 0xff) + 0x100];
      uVar7 = (ulong)(byte)((bVar2 << 2 | bVar2 >> 6) ^ bVar2 ^
                            (bVar2 << 4 | bVar2 >> 4) ^ (bVar2 << 1 | (char)bVar2 < '\0') ^
                           (bVar2 << 3 | bVar2 >> 5)) ^ 99;
      FSb[lVar6] = (uchar)uVar7;
      RSb[uVar7] = (uchar)lVar6;
    }
    lVar6 = 0;
    for (lVar10 = 0; lVar10 != 0x400; lVar10 = lVar10 + 4) {
      bVar2 = FSb[lVar6];
      bVar8 = (char)bVar2 >> 7 & 0x1bU ^ bVar2 * '\x02';
      bVar5 = bVar8 ^ bVar2;
      uVar1 = CONCAT12(bVar2,CONCAT11(bVar2,bVar8));
      *(uint *)((long)FT0 + lVar10) = CONCAT13(bVar5,uVar1);
      iVar3 = CONCAT31(uVar1,bVar5);
      *(int *)((long)FT1 + lVar10) = iVar3;
      *(uint *)((long)FT2 + lVar10) = iVar3 << 8 | (uint)bVar2;
      *(uint *)((long)FT3 + lVar10) = iVar3 << 0x10 | (uint)(uVar1 >> 8);
      if ((ulong)RSb[lVar6] == 0) {
        uVar9 = 0;
      }
      else {
        bVar2 = abStack_238[RSb[lVar6]];
        uVar9 = CONCAT13(abStack_238
                         [(ulong)(ushort)(((uint)bVar2 + (uint)abStack_238[0xb]) % 0xff) + 0x100],
                         CONCAT12(abStack_238
                                  [(ulong)(ushort)(((uint)bVar2 + (uint)abStack_238[0xd]) % 0xff) +
                                   0x100],CONCAT11(abStack_238
                                                   [(ulong)((ushort)((ushort)abStack_238[9] +
                                                                    (ushort)bVar2) % 0xff) + 0x100],
                                                   abStack_238
                                                   [(ulong)((ushort)((ushort)abStack_238[0xe] +
                                                                    (ushort)bVar2) % 0xff) + 0x100])
                                 ));
      }
      *(uint *)((long)RT0 + lVar10) = uVar9;
      *(uint *)((long)RT1 + lVar10) = uVar9 << 8 | uVar9 >> 0x18;
      *(uint *)((long)RT2 + lVar10) = uVar9 << 0x10 | uVar9 >> 0x10;
      *(uint *)((long)RT3 + lVar10) = uVar9 << 0x18 | uVar9 >> 8;
      lVar6 = lVar6 + 1;
    }
    aes_init_done = '\x01';
  }
  ctx->rk_offset = 0;
  for (uVar7 = 0; keybits >> 5 != uVar7; uVar7 = uVar7 + 1) {
    ctx->buf[uVar7] = *(uint32_t *)(key + uVar7 * 4);
  }
  iVar4 = (*(code *)(&DAT_0217a6e0 + *(int *)(&DAT_0217a6e0 + (ulong)(iVar4 - 8) * 4)))();
  return iVar4;
}

Assistant:

int mbedtls_aes_setkey_enc(mbedtls_aes_context *ctx, const unsigned char *key,
                           unsigned int keybits)
{
    uint32_t *RK;

    switch (keybits) {
        case 128: ctx->nr = 10; break;
#if !defined(MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH)
        case 192: ctx->nr = 12; break;
        case 256: ctx->nr = 14; break;
#endif /* !MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH */
        default: return MBEDTLS_ERR_AES_INVALID_KEY_LENGTH;
    }

#if !defined(MBEDTLS_AES_ROM_TABLES)
    if (aes_init_done == 0) {
        aes_gen_tables();
        aes_init_done = 1;
    }
#endif

    ctx->rk_offset = mbedtls_aes_rk_offset(ctx->buf);
    RK = ctx->buf + ctx->rk_offset;

#if defined(MBEDTLS_AESNI_HAVE_CODE)
    if (mbedtls_aesni_has_support(MBEDTLS_AESNI_AES)) {
        return mbedtls_aesni_setkey_enc((unsigned char *) RK, key, keybits);
    }
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
    if (MBEDTLS_AESCE_HAS_SUPPORT()) {
        return mbedtls_aesce_setkey_enc((unsigned char *) RK, key, keybits);
    }
#endif

#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    for (unsigned int i = 0; i < (keybits >> 5); i++) {
        RK[i] = MBEDTLS_GET_UINT32_LE(key, i << 2);
    }

    switch (ctx->nr) {
        case 10:

            for (unsigned int i = 0; i < 10; i++, RK += 4) {
                RK[4]  = RK[0] ^ round_constants[i] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[3])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[3])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[3])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[3])] << 24);

                RK[5]  = RK[1] ^ RK[4];
                RK[6]  = RK[2] ^ RK[5];
                RK[7]  = RK[3] ^ RK[6];
            }
            break;

#if !defined(MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH)
        case 12:

            for (unsigned int i = 0; i < 8; i++, RK += 6) {
                RK[6]  = RK[0] ^ round_constants[i] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[5])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[5])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[5])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[5])] << 24);

                RK[7]  = RK[1] ^ RK[6];
                RK[8]  = RK[2] ^ RK[7];
                RK[9]  = RK[3] ^ RK[8];
                RK[10] = RK[4] ^ RK[9];
                RK[11] = RK[5] ^ RK[10];
            }
            break;

        case 14:

            for (unsigned int i = 0; i < 7; i++, RK += 8) {
                RK[8]  = RK[0] ^ round_constants[i] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[7])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[7])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[7])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[7])] << 24);

                RK[9]  = RK[1] ^ RK[8];
                RK[10] = RK[2] ^ RK[9];
                RK[11] = RK[3] ^ RK[10];

                RK[12] = RK[4] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[11])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[11])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[11])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[11])] << 24);

                RK[13] = RK[5] ^ RK[12];
                RK[14] = RK[6] ^ RK[13];
                RK[15] = RK[7] ^ RK[14];
            }
            break;
#endif /* !MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH */
    }

    return 0;
#endif /* !MBEDTLS_AES_USE_HARDWARE_ONLY */
}